

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_collector.cpp
# Opt level: O1

SinkCombineResultType __thiscall
duckdb::PhysicalBatchCollector::Combine
          (PhysicalBatchCollector *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  pthread_mutex_t *__mutex;
  GlobalSinkState *pGVar1;
  LocalSinkState *pLVar2;
  int iVar3;
  
  pGVar1 = input->global_state;
  pLVar2 = input->local_state;
  __mutex = (pthread_mutex_t *)(pGVar1 + 1);
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    BatchedDataCollection::Merge
              ((BatchedDataCollection *)
               &pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
                __list,(BatchedDataCollection *)(pLVar2 + 1));
    pthread_mutex_unlock(__mutex);
    return FINISHED;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

SinkCombineResultType PhysicalBatchCollector::Combine(ExecutionContext &context,
                                                      OperatorSinkCombineInput &input) const {
	auto &gstate = input.global_state.Cast<BatchCollectorGlobalState>();
	auto &state = input.local_state.Cast<BatchCollectorLocalState>();

	lock_guard<mutex> lock(gstate.glock);
	gstate.data.Merge(state.data);

	return SinkCombineResultType::FINISHED;
}